

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O3

iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
* __thiscall
protozero::pbf_reader::get_packed<protozero::const_varint_iterator<unsigned_int>>
          (iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
           *__return_storage_ptr__,pbf_reader *this)

{
  char *pcVar1;
  uint len;
  assert_error *this_00;
  
  if (this->m_tag != 0) {
    len = get_varint<unsigned_int>(this);
    skip_bytes(this,len);
    pcVar1 = this->m_data;
    (__return_storage_ptr__->
    super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
    ).first.m_data = pcVar1 + -(ulong)len;
    (__return_storage_ptr__->
    super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
    ).first.m_end = pcVar1;
    (__return_storage_ptr__->
    super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
    ).second.m_data = pcVar1;
    (__return_storage_ptr__->
    super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
    ).second.m_end = pcVar1;
    return __return_storage_ptr__;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

iterator_range<T> get_packed() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        const auto len = get_len_and_skip();
        return {T{m_data - len, m_data},
                T{m_data, m_data}};
    }